

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

App * __thiscall CLI::App::name(App *this,string *app_name)

{
  App *base;
  ulong uVar1;
  OptionAlreadyAdded *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string *local_50;
  string *res;
  string local_38 [8];
  string oname;
  string *app_name_local;
  App *this_local;
  
  oname.field_2._8_8_ = app_name;
  if (this->parent_ == (App *)0x0) {
    ::std::__cxx11::string::operator=((string *)&this->name_,(string *)app_name);
  }
  else {
    ::std::__cxx11::string::string(local_38,(string *)&this->name_);
    ::std::__cxx11::string::operator=((string *)&this->name_,(string *)app_name);
    base = _get_fallthrough_parent(this);
    local_50 = _compare_subcommand_names_abi_cxx11_(this,this,base);
    uVar1 = ::std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      ::std::__cxx11::string::operator=((string *)&this->name_,local_38);
      this_00 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_70,app_name," conflicts with existing subcommand names");
      OptionAlreadyAdded::OptionAlreadyAdded(this_00,&local_70);
      __cxa_throw(this_00,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded);
    }
    ::std::__cxx11::string::~string(local_38);
  }
  this->has_automatic_name_ = false;
  return this;
}

Assistant:

CLI11_INLINE App *App::name(std::string app_name) {

    if(parent_ != nullptr) {
        std::string oname = name_;
        name_ = app_name;
        const auto &res = _compare_subcommand_names(*this, *_get_fallthrough_parent());
        if(!res.empty()) {
            name_ = oname;
            throw(OptionAlreadyAdded(app_name + " conflicts with existing subcommand names"));
        }
    } else {
        name_ = app_name;
    }
    has_automatic_name_ = false;
    return this;
}